

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prediction_scheme_wrap_encoding_transform.h
# Opt level: O0

void __thiscall
draco::PredictionSchemeWrapEncodingTransform<int,_int>::Init
          (PredictionSchemeWrapEncodingTransform<int,_int> *this,int *orig_data,int size,
          int num_components)

{
  int in_EDX;
  int *in_RSI;
  PredictionSchemeWrapTransformBase<int> *in_RDI;
  int i;
  int max_value;
  int min_value;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  int local_20;
  int local_1c [2];
  int local_14;
  int *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  PredictionSchemeWrapTransformBase<int>::Init(in_RDI,in_stack_ffffffffffffffcc);
  if (local_14 != 0) {
    local_20 = *local_10;
    local_1c[0] = local_20;
    for (iVar1 = 1; iVar1 < local_14; iVar1 = iVar1 + 1) {
      if (local_10[iVar1] < local_1c[0]) {
        local_1c[0] = local_10[iVar1];
      }
      else if (local_20 < local_10[iVar1]) {
        local_20 = local_10[iVar1];
      }
    }
    PredictionSchemeWrapTransformBase<int>::set_min_value(in_RDI,local_1c);
    PredictionSchemeWrapTransformBase<int>::set_max_value(in_RDI,&local_20);
    PredictionSchemeWrapTransformBase<int>::InitCorrectionBounds
              ((PredictionSchemeWrapTransformBase<int> *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void Init(const DataTypeT *orig_data, int size, int num_components) {
    PredictionSchemeWrapTransformBase<DataTypeT>::Init(num_components);
    // Go over the original values and compute the bounds.
    if (size == 0) {
      return;
    }
    DataTypeT min_value = orig_data[0];
    DataTypeT max_value = min_value;
    for (int i = 1; i < size; ++i) {
      if (orig_data[i] < min_value) {
        min_value = orig_data[i];
      } else if (orig_data[i] > max_value) {
        max_value = orig_data[i];
      }
    }
    this->set_min_value(min_value);
    this->set_max_value(max_value);
    this->InitCorrectionBounds();
  }